

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ted_algorithm_touzet.h
# Opt level: O3

void __thiscall
ted::TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
init_matrices(TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              *this,int t1_size,int k)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 local_60 [24];
  pointer pdStack_48;
  pointer local_40;
  size_t local_38;
  
  sVar7 = (size_t)k;
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_60,(long)t1_size,sVar7 * 2 + 1);
  (this->td_).super_Matrix<double>.rows_ = local_60._0_8_;
  (this->td_).super_Matrix<double>.columns_ = local_60._8_8_;
  pdVar1 = (this->td_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (this->td_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->td_).super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)local_60._16_8_;
  (this->td_).super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = pdStack_48;
  (this->td_).super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = local_40;
  stack0xffffffffffffffb0 = (undefined1  [16])0x0;
  local_40 = (pointer)0x0;
  local_38 = sVar7;
  if (pdVar1 == (pointer)0x0) {
    (this->td_).band_width_ = sVar7;
  }
  else {
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
    (this->td_).band_width_ = local_38;
    if ((pointer)local_60._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_60._16_8_,(long)local_40 - local_60._16_8_);
    }
  }
  auVar4 = _DAT_00111040;
  auVar3 = _DAT_00111030;
  pdVar1 = (this->td_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (this->td_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar1 != pdVar2) {
    uVar5 = (long)pdVar2 + (-8 - (long)pdVar1);
    auVar12._8_4_ = (int)uVar5;
    auVar12._0_8_ = uVar5;
    auVar12._12_4_ = (int)(uVar5 >> 0x20);
    auVar8._0_8_ = uVar5 >> 3;
    auVar8._8_8_ = auVar12._8_8_ >> 3;
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_00111040;
    do {
      auVar11._8_4_ = (int)uVar6;
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = (int)(uVar6 >> 0x20);
      auVar12 = (auVar11 | auVar3) ^ auVar4;
      if ((bool)(~(auVar12._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar12._0_4_ ||
                  auVar8._4_4_ < auVar12._4_4_) & 1)) {
        pdVar1[uVar6] = INFINITY;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        pdVar1[uVar6 + 1] = INFINITY;
      }
      uVar6 = uVar6 + 2;
    } while (((uVar5 >> 3) + 2 & 0x3ffffffffffffffe) != uVar6);
  }
  data_structures::Matrix<double>::Matrix
            ((Matrix<double> *)local_60,(long)(t1_size + 1),sVar7 * 2 + 3);
  (this->fd_).super_Matrix<double>.rows_ = local_60._0_8_;
  (this->fd_).super_Matrix<double>.columns_ = local_60._8_8_;
  pdVar1 = (this->fd_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (this->fd_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->fd_).super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)local_60._16_8_;
  (this->fd_).super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = pdStack_48;
  (this->fd_).super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = local_40;
  stack0xffffffffffffffb0 = (undefined1  [16])0x0;
  local_40 = (pointer)0x0;
  if (pdVar1 == (pointer)0x0) {
    (this->fd_).band_width_ = sVar7 + 1;
  }
  else {
    local_38 = sVar7 + 1;
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
    (this->fd_).band_width_ = local_38;
    if ((pointer)local_60._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_60._16_8_,(long)local_40 - local_60._16_8_);
    }
  }
  auVar4 = _DAT_00111040;
  auVar3 = _DAT_00111030;
  pdVar1 = (this->fd_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (this->fd_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar1 != pdVar2) {
    uVar5 = (long)pdVar2 + (-8 - (long)pdVar1);
    auVar9._8_4_ = (int)uVar5;
    auVar9._0_8_ = uVar5;
    auVar9._12_4_ = (int)(uVar5 >> 0x20);
    auVar10._0_8_ = uVar5 >> 3;
    auVar10._8_8_ = auVar9._8_8_ >> 3;
    uVar6 = 0;
    auVar10 = auVar10 ^ _DAT_00111040;
    do {
      auVar13._8_4_ = (int)uVar6;
      auVar13._0_8_ = uVar6;
      auVar13._12_4_ = (int)(uVar6 >> 0x20);
      auVar12 = (auVar13 | auVar3) ^ auVar4;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        pdVar1[uVar6] = INFINITY;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        pdVar1[uVar6 + 1] = INFINITY;
      }
      uVar6 = uVar6 + 2;
    } while (((uVar5 >> 3) + 2 & 0x3ffffffffffffffe) != uVar6);
  }
  return;
}

Assistant:

void init_matrices(int t1_size, int k) {
    using data_structures::BandMatrix;
    // NOTE: The default constructor of Matrix is called while constructing
    //       the algorithm object.
    // QUESTION: Shouldn't we implement Matrix::resize() instead of constructing
    //           matrix again?
    // NOTE: The k may be larger than |T2| that uses more memory than needed.
    td_ = BandMatrix<double>(t1_size, k);
    // Fill in for initially marking all subtree pairs as not eligable, and for debugging.
    // td_.fill_with(std::numeric_limits<double>::signaling_NaN());
    td_.Matrix::fill_with(std::numeric_limits<double>::infinity());
    // NOTE: The band_width=e for Touzet's fd_ matrix varies. It is however
    //       smaller or equal to the initialised band_width=k+1. As long as we
    //       read and write using the original band_width, addresses are not
    //       messed up. We only have to ensure that we do not iterate over too
    //       many elements using k instead of e.
    fd_ = BandMatrix<double>(t1_size + 1, k + 1);
    fd_.Matrix::fill_with(std::numeric_limits<double>::infinity());
  }